

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

ExportedNames * __thiscall
Js::SourceTextModuleRecord::GetExportedNames
          (SourceTextModuleRecord *this,ExportModuleRecordList *exportStarSet)

{
  anon_class_24_3_71043af8_for_fn fn;
  anon_class_16_2_d619bfae_for_fn fn_00;
  anon_class_16_2_d619bfae_for_fn fn_01;
  bool bVar1;
  SList<int,_Memory::ArenaAllocator,_RealCount> **ppSVar2;
  ScriptContext *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  SList<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> **ppSVar4;
  SourceTextModuleRecord *pSVar5;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  TrackAllocData local_130;
  SourceTextModuleRecord *local_108;
  SourceTextModuleRecord *local_100;
  code *local_f8;
  undefined8 local_f0;
  TrackAllocData local_e8;
  SourceTextModuleRecord *local_c0;
  SourceTextModuleRecord *local_b8;
  code *local_b0;
  undefined8 local_a8;
  TrackAllocData local_a0;
  SourceTextModuleRecord *local_78;
  ExportedNames *tempExportedNames;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_30;
  ArenaAllocator *allocator;
  SList<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount> *pSStack_20;
  bool isRootGetExportedNames;
  ExportModuleRecordList *exportStarSet_local;
  SourceTextModuleRecord *this_local;
  
  allocator._7_1_ = exportStarSet == (ExportModuleRecordList *)0x0;
  pSStack_20 = exportStarSet;
  exportStarSet_local = (ExportModuleRecordList *)this;
  if (((bool)allocator._7_1_) &&
     (ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                          ((WriteBarrierPtr *)&this->exportedNames),
     *ppSVar2 != (SList<int,_Memory::ArenaAllocator,_RealCount> *)0x0)) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                        ((WriteBarrierPtr *)&this->exportedNames);
    return *ppSVar2;
  }
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
  pAVar3 = &ScriptContext::GeneralAllocator(this_00)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  local_30 = pAVar3;
  if (pSStack_20 == (SList<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,
               (type_info *)&SList<Js::ModuleRecordBase*,Memory::ArenaAllocator,RealCount>::typeinfo
               ,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
               ,0x1db);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar3,&local_58);
    local_68 = Memory::ArenaAllocator::Alloc;
    local_60 = 0;
    this_01 = (SList<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount> *)
              new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar3,0x3f67b0);
    SList<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>::SList
              (this_01,(ArenaAllocator *)local_30);
    pSStack_20 = this_01;
  }
  bVar1 = SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>::Has
                    (&pSStack_20->
                      super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>,
                     &this->super_ModuleRecordBase);
  if (bVar1) {
    this_local = (SourceTextModuleRecord *)0x0;
  }
  else {
    tempExportedNames = (ExportedNames *)this;
    SList<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>::Prepend
              (pSStack_20,(ModuleRecordBase **)&tempExportedNames);
    local_78 = (SourceTextModuleRecord *)0x0;
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                        ((WriteBarrierPtr *)&this->localExportRecordList);
    pAVar3 = local_30;
    if (*ppSVar4 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_a0,(type_info *)&SList<int,Memory::ArenaAllocator,RealCount>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                 ,0x1e6);
      pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar3,&local_a0);
      local_b0 = Memory::ArenaAllocator::Alloc;
      local_a8 = 0;
      pSVar5 = (SourceTextModuleRecord *)
               new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar3,0x3f67b0);
      SList<int,_Memory::ArenaAllocator,_RealCount>::SList
                ((SList<int,_Memory::ArenaAllocator,_RealCount> *)pSVar5,(ArenaAllocator *)local_30)
      ;
      local_78 = pSVar5;
      pSVar6 = Memory::
               WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>
               ::operator->(&this->localExportRecordList);
      local_b8 = local_78;
      fn_01.tempExportedNames = (ExportedNames *)local_78;
      fn_01.this = this;
      local_c0 = this;
      SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount>::
      Map<Js::SourceTextModuleRecord::GetExportedNames(SList<Js::ModuleRecordBase*,Memory::ArenaAllocator,RealCount>*)::__0>
                ((SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount> *)pSVar6,
                 fn_01);
    }
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                        ((WriteBarrierPtr *)&this->indirectExportRecordList);
    pAVar3 = local_30;
    if (*ppSVar4 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      if (local_78 == (SourceTextModuleRecord *)0x0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_e8,(type_info *)&SList<int,Memory::ArenaAllocator,RealCount>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                   ,0x1f0);
        pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar3,&local_e8);
        local_f8 = Memory::ArenaAllocator::Alloc;
        local_f0 = 0;
        pSVar5 = (SourceTextModuleRecord *)
                 new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar3,0x3f67b0);
        SList<int,_Memory::ArenaAllocator,_RealCount>::SList
                  ((SList<int,_Memory::ArenaAllocator,_RealCount> *)pSVar5,
                   (ArenaAllocator *)local_30);
        local_78 = pSVar5;
      }
      pSVar6 = Memory::
               WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>
               ::operator->(&this->indirectExportRecordList);
      local_100 = local_78;
      fn_00.tempExportedNames = (ExportedNames *)local_78;
      fn_00.this = this;
      local_108 = this;
      SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount>::
      Map<Js::SourceTextModuleRecord::GetExportedNames(SList<Js::ModuleRecordBase*,Memory::ArenaAllocator,RealCount>*)::__1>
                ((SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount> *)pSVar6,
                 fn_00);
    }
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                        ((WriteBarrierPtr *)&this->starExportRecordList);
    pAVar3 = local_30;
    if (*ppSVar4 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      if (local_78 == (SourceTextModuleRecord *)0x0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_130,(type_info *)&SList<int,Memory::ArenaAllocator,RealCount>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                   ,0x1fb);
        pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar3,&local_130);
        pSVar5 = (SourceTextModuleRecord *)
                 new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar3,0x3f67b0);
        SList<int,_Memory::ArenaAllocator,_RealCount>::SList
                  ((SList<int,_Memory::ArenaAllocator,_RealCount> *)pSVar5,
                   (ArenaAllocator *)local_30);
        local_78 = pSVar5;
      }
      pSVar6 = Memory::
               WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>
               ::operator->(&this->starExportRecordList);
      fn.exportStarSet = pSStack_20;
      fn.this = this;
      fn.tempExportedNames = (ExportedNames *)local_78;
      SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount>::
      Map<Js::SourceTextModuleRecord::GetExportedNames(SList<Js::ModuleRecordBase*,Memory::ArenaAllocator,RealCount>*)::__2>
                ((SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount> *)pSVar6,fn)
      ;
    }
    if ((allocator._7_1_ & 1) != 0) {
      Memory::WriteBarrierPtr<SList<int,_Memory::ArenaAllocator,_RealCount>_>::operator=
                (&this->exportedNames,(SList<int,_Memory::ArenaAllocator,_RealCount> *)local_78);
    }
    this_local = local_78;
  }
  return (ExportedNames *)this_local;
}

Assistant:

ExportedNames* SourceTextModuleRecord::GetExportedNames(ExportModuleRecordList* exportStarSet)
    {
        const bool isRootGetExportedNames = (exportStarSet == nullptr);

        // this->exportedNames only caches root "GetExportedNames(nullptr)"
        if (isRootGetExportedNames && exportedNames != nullptr)
        {
            return exportedNames;
        }

        ArenaAllocator* allocator = scriptContext->GeneralAllocator();

        if (exportStarSet == nullptr)
        {
            exportStarSet = Anew(allocator, ExportModuleRecordList, allocator);
        }
        if (exportStarSet->Has(this))
        {
            return nullptr;
        }
        exportStarSet->Prepend(this);

        ExportedNames* tempExportedNames = nullptr;
        if (this->localExportRecordList != nullptr)
        {
            tempExportedNames = Anew(allocator, ExportedNames, allocator);
            this->localExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                tempExportedNames->Prepend(exportNameId);
            });
        }
        if (this->indirectExportRecordList != nullptr)
        {
            if (tempExportedNames == nullptr)
            {
                tempExportedNames = Anew(allocator, ExportedNames, allocator);
            }
            this->indirectExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportedNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                tempExportedNames->Prepend(exportedNameId);
            });
        }
        if (this->starExportRecordList != nullptr)
        {
            if (tempExportedNames == nullptr)
            {
                tempExportedNames = Anew(allocator, ExportedNames, allocator);
            }
            this->starExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                Assert(exportEntry.moduleRequest != nullptr);
                SourceTextModuleRecord* moduleRecord = nullptr;
                if (this->childrenModuleSet->TryGetValue(exportEntry.moduleRequest->Psz(), &moduleRecord))
                {
                    Assert(moduleRecord->WasParsed());
                    Assert(moduleRecord->WasDeclarationInitialized()); // we should be half way during initialization
                    Assert(!moduleRecord->WasEvaluated());
                    ExportedNames* starExportedNames = moduleRecord->GetExportedNames(exportStarSet);
                    // We are not rejecting ambiguous resolution at this time.
                    if (starExportedNames != nullptr)
                    {
                        starExportedNames->Map([&](PropertyId propertyId) {
                            if (propertyId != PropertyIds::default_ && !tempExportedNames->Has(propertyId))
                            {
                                tempExportedNames->Prepend(propertyId);
                            }
                        });
                    }
                }
#if DBG
                else
                {
                    AssertMsg(false, "dependent modules should have been initialized");
                }
#endif
            });
        }

        // this->exportedNames only caches root "GetExportedNames(nullptr)"
        if (isRootGetExportedNames)
        {
            exportedNames = tempExportedNames;
        }

        return tempExportedNames;
    }